

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcArithmeticCodec.cpp
# Opt level: O0

void __thiscall o3dgc::Arithmetic_Codec::start_encoder(Arithmetic_Codec *this)

{
  Arithmetic_Codec *this_local;
  
  if (this->mode != 0) {
    AC_Error("cannot start encoder");
  }
  if (this->buffer_size == 0) {
    AC_Error("no code buffer set");
  }
  this->mode = 1;
  this->base = 0;
  this->length = 0xffffffff;
  this->ac_pointer = this->code_buffer;
  return;
}

Assistant:

void Arithmetic_Codec::start_encoder(void)
    {
      if (mode != 0) AC_Error("cannot start encoder");
      if (buffer_size == 0) AC_Error("no code buffer set");

      mode   = 1;
      base   = 0;            // initialize encoder variables: interval and pointer
      length = AC__MaxLength;
      ac_pointer = code_buffer;                       // pointer to next data byte
    }